

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

ags_t AGSSock::Socket_SendTo(Socket *sock,SockAddr *addr,char *str)

{
  size_t __n;
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  
  __n = strlen(str);
  if (__n == 0) {
    uVar4 = 1;
  }
  else {
    do {
      sVar1 = sendto(sock->id,str,__n,0,(sockaddr *)addr,0x80);
      if (sVar1 == -1) break;
      str = str + sVar1;
      __n = __n - sVar1;
    } while (__n != 0);
    uVar4 = (ulong)(sVar1 != -1);
  }
  piVar2 = __errno_location();
  iVar3 = 0;
  if (*piVar2 != 0xb) {
    iVar3 = *piVar2;
  }
  sock->error = iVar3;
  return uVar4;
}

Assistant:

ags_t Socket_SendTo(Socket *sock, const SockAddr *addr, const char *str)
{
	return sendto_impl(sock, addr, str, strlen(str));
}